

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sales.cpp
# Opt level: O3

double * __thiscall L15_4::Sales::operator[](Sales *this,int i)

{
  logic_error *this_00;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  if ((uint)i < 0xd) {
    return this->_gross + (uint)i;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x18);
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_48,"Index Error in Sales Object\n","");
  std::logic_error::logic_error(this_00,(string *)local_48);
  *(undefined ***)this_00 = &PTR__logic_error_00134a98;
  *(int *)(this_00 + 0x10) = i;
  __cxa_throw(this_00,&BadIndex::typeinfo,std::logic_error::~logic_error);
}

Assistant:

double & Sales::operator[](int i) {
        if (i < 0 || i > MONTHS) {
            throw BadIndex(i);
        }
        return _gross[i];
    }